

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_xml.c
# Opt level: O3

LY_ERR lydxml_data_skip(lyxml_ctx *xmlctx)

{
  uint uVar1;
  LYXML_PARSER_STATUS LVar2;
  LY_ERR LVar3;
  
  uVar1 = (xmlctx->elements).count;
  if (uVar1 == 0) {
    __assert_fail("parents_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                  ,0x16f,"LY_ERR lydxml_data_skip(struct lyxml_ctx *)");
  }
  while (LVar2 = xmlctx->status, LVar3 = lyxml_ctx_next(xmlctx), LVar2 != LYXML_ELEM_CONTENT) {
    if (LVar3 != LY_SUCCESS) {
      return LVar3;
    }
  }
  while( true ) {
    if (LVar3 != LY_SUCCESS) {
      return LVar3;
    }
    if ((xmlctx->elements).count < uVar1) break;
    LVar3 = lyxml_ctx_next(xmlctx);
  }
  if (xmlctx->status == LYXML_ELEM_CLOSE) {
    LVar3 = lyxml_ctx_next(xmlctx);
    return LVar3;
  }
  __assert_fail("xmlctx->status == LYXML_ELEM_CLOSE",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                ,0x17d,"LY_ERR lydxml_data_skip(struct lyxml_ctx *)");
}

Assistant:

static LY_ERR
lydxml_data_skip(struct lyxml_ctx *xmlctx)
{
    uint32_t parents_count;

    /* remember current number of parents */
    parents_count = xmlctx->elements.count;
    assert(parents_count);

    /* skip after the content */
    while (xmlctx->status != LYXML_ELEM_CONTENT) {
        LY_CHECK_RET(lyxml_ctx_next(xmlctx));
    }
    LY_CHECK_RET(lyxml_ctx_next(xmlctx));

    /* skip all children elements, recursively, if any */
    while (parents_count <= xmlctx->elements.count) {
        LY_CHECK_RET(lyxml_ctx_next(xmlctx));
    }

    /* close element */
    assert(xmlctx->status == LYXML_ELEM_CLOSE);
    LY_CHECK_RET(lyxml_ctx_next(xmlctx));

    return LY_SUCCESS;
}